

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void initialize_regressor<dense_parameters>(vw *all,dense_parameters *weights)

{
  uint32_t uVar1;
  weight *__ptr;
  uint32_t uVar2;
  float *pfVar3;
  ostream *poVar4;
  vw_exception *this;
  byte bVar5;
  size_t nmemb;
  stringstream __msg;
  string local_1f0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  __ptr = weights->_begin;
  if (weights->_weight_mask == 0 || __ptr == (weight *)0x0) {
    uVar2 = all->num_bits;
    uVar1 = weights->_stride_shift;
    if ((__ptr != (weight *)0x0) && (weights->_seeded == false)) {
      free(__ptr);
      weights->_begin = (weight *)0x0;
    }
    bVar5 = (byte)uVar1;
    nmemb = (1L << ((byte)uVar2 & 0x3f)) << (bVar5 & 0x3f);
    pfVar3 = calloc_or_throw<float>(nmemb);
    weights->_begin = pfVar3;
    weights->_weight_mask = nmemb - 1;
    weights->_stride_shift = uVar1;
    weights->_seeded = false;
    if (nmemb - 1 == 0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a0," Failed to allocate weight array with ",0x26);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," bits: try decreasing -b <bits>",0x1f);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x74,local_1f0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((all->initial_weight != 0.0) || (NAN(all->initial_weight))) {
      if (pfVar3 != pfVar3 + nmemb) {
        do {
          *pfVar3 = all->initial_weight;
          pfVar3 = pfVar3 + (1L << (bVar5 & 0x3f));
        } while (pfVar3 != weights->_begin + weights->_weight_mask + 1);
      }
    }
    else {
      if (all->random_positive_weights == true) {
        dense_parameters::set_default<random_positive_wrapper<dense_parameters>>(weights);
        return;
      }
      if (all->random_weights == true) {
        dense_parameters::set_default<random_weights_wrapper<dense_parameters>>(weights);
        return;
      }
      if (all->normal_weights == true) {
        dense_parameters::set_default<polar_normal_weights_wrapper<dense_parameters>>(weights);
        return;
      }
      if (all->tnormal_weights == true) {
        dense_parameters::set_default<polar_normal_weights_wrapper<dense_parameters>>(weights);
        truncate<dense_parameters>(all,weights);
        return;
      }
    }
  }
  return;
}

Assistant:

void initialize_regressor(vw& all, T& weights)
{
  // Regressor is already initialized.

  if (weights.not_null())
    return;
  size_t length = ((size_t)1) << all.num_bits;
  try
  {
    uint32_t ss = weights.stride_shift();
    weights.~T();  // dealloc so that we can realloc, now with a known size
    new (&weights) T(length, ss);
  }
  catch (const VW::vw_exception&)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  if (weights.mask() == 0)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  else if (all.initial_weight != 0.)
    weights.template set_default<float, set_initial_wrapper<T> >(all.initial_weight);
  else if (all.random_positive_weights)
    weights.template set_default<random_positive_wrapper<T> >();
  else if (all.random_weights)
    weights.template set_default<random_weights_wrapper<T> >();
  else if (all.normal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
  }
  else if (all.tnormal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
    truncate(all, weights);
  }
}